

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O2

sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::grow_(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,size_t count,
       sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *t)

{
  chunk *back;
  chunk *next;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  long lVar3;
  ulong uVar4;
  chunk *this_00;
  size_t size;
  undefined1 auVar5 [16];
  double dVar6;
  
  back = this->current_chunk_;
  if (back == (chunk *)0x0) {
    size = 0x100;
    if (0x100 < count) {
      size = count;
    }
    this_00 = (chunk *)operator_new(0x28);
    chunk::chunk(this_00,size,t,count,(chunk *)0x0,(chunk *)0x0);
  }
  else {
    back->curr_ = this->curr_;
    next = back->next_;
    if (next != (chunk *)0x0) {
      psVar1 = next->begin_;
      psVar2 = next->end_;
      if (count <= (ulong)(((long)psVar2 - (long)psVar1) / 0x28)) {
        this->current_chunk_ = next;
        next->curr_ = psVar1 + count;
        this->curr_ = psVar1 + count;
        this->end_ = psVar2;
        this->begin_ = psVar1;
        std::
        __fill_n_a<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>*,unsigned_long,boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                  (psVar1,count,t);
        return this->begin_;
      }
    }
    lVar3 = ((long)back->end_ - (long)back->begin_) / 0x28;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 1.5;
    uVar4 = (ulong)dVar6;
    uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    if (uVar4 <= count) {
      uVar4 = count;
    }
    this_00 = (chunk *)operator_new(0x28);
    chunk::chunk(this_00,uVar4,t,count,back,next);
  }
  this->current_chunk_ = this_00;
  psVar1 = this_00->begin_;
  this->begin_ = psVar1;
  psVar2 = this_00->end_;
  this->curr_ = this_00->curr_;
  this->end_ = psVar2;
  return psVar1;
}

Assistant:

T *grow_(std::size_t count, T const &t)
    {
        if(this->current_chunk_)
        {
            // write the cached value of current into the expr.
            // OK to do this even if later statements throw.
            this->current_chunk_->curr_ = this->curr_;

            // Do we have a expr with enough available memory already?
            if(this->current_chunk_->next_ && count <= this->current_chunk_->next_->size())
            {
                this->current_chunk_ = this->current_chunk_->next_;
                this->curr_ = this->current_chunk_->curr_ = this->current_chunk_->begin_ + count;
                this->end_ = this->current_chunk_->end_;
                this->begin_ = this->current_chunk_->begin_;
                std::fill_n(this->begin_, count, t);
                return this->begin_;
            }

            // grow exponentially
            std::size_t new_size = (std::max)(
                count
              , static_cast<std::size_t>(static_cast<double>(this->current_chunk_->size()) * 1.5)
            );

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, this->current_chunk_, this->current_chunk_->next_);
        }
        else
        {
            // first chunk is 256
            std::size_t new_size = (std::max)(count, static_cast<std::size_t>(256U));

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, 0, 0);
        }

        this->begin_ = this->current_chunk_->begin_;
        this->curr_ = this->current_chunk_->curr_;
        this->end_ = this->current_chunk_->end_;
        return this->begin_;
    }